

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)56,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)8,_2> dst;
  undefined1 local_34 [20];
  
  Op<(moira::Mode)8,2>((Ea<(moira::Mode)8,_2> *)local_34,this,op & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Dn)(op >> 9 & 7));
  StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)8,_2> *)local_34);
  return;
}

Assistant:

void
Moira::dasmAndRgEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}